

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseCFG.h
# Opt level: O3

CFG * __thiscall
covenant::parse_cfg<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
          (CFG *__return_storage_ptr__,covenant *this,StrParse *input,
          shared_ptr<covenant::TerminalFactory> *tfac)

{
  element_type *peVar1;
  sp_counted_base *psVar2;
  string *psVar3;
  NonTerminalMap mapping;
  shared_count local_88;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  peVar1 = *(element_type **)input;
  psVar2 = (sp_counted_base *)(input->str)._M_dataplus._M_p;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  local_88.pi_ = psVar2;
  boost::unordered::
  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&__return_storage_ptr__->TrackedTerms);
  __return_storage_ptr__->alphsz = 0x7fff;
  __return_storage_ptr__->alphstart = 0;
  __return_storage_ptr__->start = 0;
  (__return_storage_ptr__->prods).
  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->prods).
  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->prods).
  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rules).
  super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rules).
  super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->rules).
  super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_tfac).px = peVar1;
  (__return_storage_ptr__->_tfac).pn.pi_ = psVar2;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    psVar2->use_count_ = psVar2->use_count_ + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count(&local_88);
  local_60.
  super_functions<boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .current_ = '\0';
  local_60.bucket_count_ = 0x10;
  local_60.size_ = 0;
  local_60.mlf_ = 1.0;
  local_60.max_load_ = 0;
  local_60.buckets_ = (bucket_pointer)0x0;
  parse_rules<covenant::StrParse>
            ((StrParse *)this,__return_storage_ptr__,(NonTerminalMap *)&local_60);
  if ((ulong)*(uint *)this < *(ulong *)(this + 0x10)) {
    consume_blanks<covenant::StrParse>((StrParse *)this);
    if (((ulong)*(uint *)this < *(ulong *)(this + 0x10)) &&
       (*(char *)(*(long *)(this + 8) + (ulong)*(uint *)this) != ')')) {
      psVar3 = (string *)__cxa_allocate_exception(0x20);
      local_80 = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"during the parsing of the cfg","");
      *(string **)psVar3 = psVar3 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar3,local_80,local_80 + local_78);
      __cxa_throw(psVar3,&error::typeinfo,error::~error);
    }
  }
  boost::unordered::detail::
  table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~table(&local_60);
  return __return_storage_ptr__;
}

Assistant:

CFG parse_cfg(In& input, TerminalFactory tfac)
{
  CFG g(tfac);

  NonTerminalMap mapping;
  parse_rules(input, g, mapping);
  if(input.empty()) return g;
  consume_blanks(input);
  // the special case if input.peek() == ')' is in case we read the
  // format (elem (##VARS##) (##CFL##))
  if (input.empty() || input.peek() == ')') 
    return g;
  
  throw error("during the parsing of the cfg");
}